

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

bool __thiscall
Js::JITPageAddrToFuncRangeCache::IsNativeAddr(JITPageAddrToFuncRangeCache *this,void *address)

{
  bool bVar1;
  CriticalSection *cs;
  bool local_6b;
  BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_38;
  RangeMap *rangeMap;
  void *pageAddr;
  AutoCriticalSection autocs;
  void *address_local;
  JITPageAddrToFuncRangeCache *this_local;
  
  autocs.cs = (CriticalSection *)address;
  cs = GetCriticalSection();
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&pageAddr,cs);
  rangeMap = (RangeMap *)GetPageAddr(this,autocs.cs);
  local_38 = (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)0x0;
  if (((this->jitPageAddrToFuncRangeMap == (JITPageAddrToFuncRangeMap *)0x0) ||
      (bVar1 = JsUtil::
               BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
               ::TryGetValue<void*>
                         ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                           *)this->jitPageAddrToFuncRangeMap,&rangeMap,&local_38), !bVar1)) ||
     (bVar1 = JsUtil::
              BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::MapUntil<Js::JITPageAddrToFuncRangeCache::IsNativeAddr(void*)::__0>
                        ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)local_38,(anon_class_8_1_3ef1ced4_for_fn)&autocs), !bVar1)) {
    local_6b = false;
    if (this->largeJitFuncToSizeMap != (LargeJITFuncAddrToSizeMap *)0x0) {
      local_6b = JsUtil::
                 BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                 ::MapUntil<Js::JITPageAddrToFuncRangeCache::IsNativeAddr(void*)::__1>
                           ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                             *)this->largeJitFuncToSizeMap,(anon_class_8_1_3ef1ced4_for_fn)&autocs);
    }
    this_local._7_1_ = local_6b;
  }
  else {
    this_local._7_1_ = true;
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&pageAddr);
  return this_local._7_1_;
}

Assistant:

bool JITPageAddrToFuncRangeCache::IsNativeAddr(void * address)
    {
        AutoCriticalSection autocs(GetCriticalSection());

        void * pageAddr = GetPageAddr(address);
        RangeMap * rangeMap = nullptr;
        if (jitPageAddrToFuncRangeMap && jitPageAddrToFuncRangeMap->TryGetValue(pageAddr, &rangeMap))
        {
            if (rangeMap->MapUntil(
                [&](void* key, uint value) {
                return (key <= address && (uintptr_t)address < ((uintptr_t)key + value));
            }))
            {
                return true;
            }
        }

        return largeJitFuncToSizeMap && largeJitFuncToSizeMap->MapUntil(
            [&](void *key, uint value) {
            return (key <= address && (uintptr_t)address < ((uintptr_t)key + value));
        });
    }